

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

void __thiscall
ImageTypeManager::setFunctionTable
          (ImageTypeManager *this,uint8_t type,FunctionTableHolder *table,bool forceSetup)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type *__dest;
  _Base_ptr p_Var3;
  bool bVar4;
  uint8_t local_9;
  
  p_Var1 = &(this->_functionTableMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->_functionTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar4]) {
    bVar4 = (byte)(char)p_Var2[1]._M_color < type;
    if (!bVar4) {
      p_Var3 = p_Var2;
    }
  }
  p_Var2 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var2 = p_Var3, type < (byte)(char)p_Var3[1]._M_color)) {
    p_Var2 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var2 == p_Var1) {
    local_9 = type;
    __dest = std::
             map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
             ::operator[](&this->_functionTableMap,&local_9);
    memcpy(__dest,table,0x108);
  }
  else {
    if ((p_Var2[1]._M_parent == (_Base_ptr)0x0) ||
       ((forceSetup && (table->AbsoluteDifference != (AbsoluteDifferenceForm4)0x0)))) {
      p_Var2[1]._M_parent = (_Base_ptr)table->AbsoluteDifference;
    }
    if ((p_Var2[1]._M_left == (_Base_ptr)0x0) ||
       ((forceSetup && (table->Accumulate != (AccumulateForm2)0x0)))) {
      p_Var2[1]._M_left = (_Base_ptr)table->Accumulate;
    }
    if ((p_Var2[1]._M_right == (_Base_ptr)0x0) ||
       ((forceSetup && (table->BitwiseAnd != (BitwiseAndForm4)0x0)))) {
      p_Var2[1]._M_right = (_Base_ptr)table->BitwiseAnd;
    }
    if ((*(long *)(p_Var2 + 2) == 0) || ((forceSetup && (table->BitwiseOr != (BitwiseOrForm4)0x0))))
    {
      *(BitwiseOrForm4 *)(p_Var2 + 2) = table->BitwiseOr;
    }
    if ((p_Var2[2]._M_parent == (_Base_ptr)0x0) ||
       ((forceSetup && (table->BitwiseXor != (BitwiseXorForm4)0x0)))) {
      p_Var2[2]._M_parent = (_Base_ptr)table->BitwiseXor;
    }
    if ((p_Var2[2]._M_left == (_Base_ptr)0x0) ||
       ((forceSetup && (table->ConvertToGrayScale != (ConvertToGrayScaleForm4)0x0)))) {
      p_Var2[2]._M_left = (_Base_ptr)table->ConvertToGrayScale;
    }
    if ((p_Var2[2]._M_right == (_Base_ptr)0x0) ||
       ((forceSetup && (table->ConvertToRgb != (ConvertToRgbForm4)0x0)))) {
      p_Var2[2]._M_right = (_Base_ptr)table->ConvertToRgb;
    }
    if ((*(long *)(p_Var2 + 3) == 0) || ((forceSetup && (table->Copy != (CopyForm3)0x0)))) {
      *(CopyForm3 *)(p_Var2 + 3) = table->Copy;
    }
    if ((p_Var2[3]._M_parent == (_Base_ptr)0x0) ||
       ((forceSetup && (table->ExtractChannel != (ExtractChannelForm4)0x0)))) {
      p_Var2[3]._M_parent = (_Base_ptr)table->ExtractChannel;
    }
    if ((p_Var2[3]._M_left == (_Base_ptr)0x0) || ((forceSetup && (table->Fill != (FillForm2)0x0))))
    {
      p_Var2[3]._M_left = (_Base_ptr)table->Fill;
    }
    if ((p_Var2[3]._M_right == (_Base_ptr)0x0) || ((forceSetup && (table->Flip != (FlipForm4)0x0))))
    {
      p_Var2[3]._M_right = (_Base_ptr)table->Flip;
    }
    if ((*(long *)(p_Var2 + 4) == 0) ||
       ((forceSetup && (table->GammaCorrection != (GammaCorrectionForm4)0x0)))) {
      *(GammaCorrectionForm4 *)(p_Var2 + 4) = table->GammaCorrection;
    }
    if ((p_Var2[4]._M_parent == (_Base_ptr)0x0) ||
       ((forceSetup && (table->GetPixel != (GetPixelForm1)0x0)))) {
      p_Var2[4]._M_parent = (_Base_ptr)table->GetPixel;
    }
    if ((p_Var2[4]._M_left == (_Base_ptr)0x0) ||
       ((forceSetup && (table->Histogram != (HistogramForm4)0x0)))) {
      p_Var2[4]._M_left = (_Base_ptr)table->Histogram;
    }
    if ((p_Var2[4]._M_right == (_Base_ptr)0x0) ||
       ((forceSetup && (table->Invert != (InvertForm4)0x0)))) {
      p_Var2[4]._M_right = (_Base_ptr)table->Invert;
    }
    if ((*(long *)(p_Var2 + 5) == 0) || ((forceSetup && (table->IsEqual != (IsEqualForm2)0x0)))) {
      *(IsEqualForm2 *)(p_Var2 + 5) = table->IsEqual;
    }
    if ((p_Var2[5]._M_parent == (_Base_ptr)0x0) ||
       ((forceSetup && (table->LookupTable != (LookupTableForm4)0x0)))) {
      p_Var2[5]._M_parent = (_Base_ptr)table->LookupTable;
    }
    if ((p_Var2[5]._M_left == (_Base_ptr)0x0) ||
       ((forceSetup && (table->Maximum != (MaximumForm4)0x0)))) {
      p_Var2[5]._M_left = (_Base_ptr)table->Maximum;
    }
    if ((p_Var2[5]._M_right == (_Base_ptr)0x0) ||
       ((forceSetup && (table->Merge != (MergeForm4)0x0)))) {
      p_Var2[5]._M_right = (_Base_ptr)table->Merge;
    }
    if ((*(long *)(p_Var2 + 6) == 0) || ((forceSetup && (table->Minimum != (MinimumForm4)0x0)))) {
      *(MinimumForm4 *)(p_Var2 + 6) = table->Minimum;
    }
    if ((p_Var2[6]._M_parent == (_Base_ptr)0x0) ||
       ((forceSetup && (table->Normalize != (NormalizeForm4)0x0)))) {
      p_Var2[6]._M_parent = (_Base_ptr)table->Normalize;
    }
    if ((p_Var2[6]._M_left == (_Base_ptr)0x0) ||
       ((forceSetup && (table->ProjectionProfile != (ProjectionProfileForm4)0x0)))) {
      p_Var2[6]._M_left = (_Base_ptr)table->ProjectionProfile;
    }
    if ((p_Var2[6]._M_right == (_Base_ptr)0x0) ||
       ((forceSetup && (table->Resize != (ResizeForm4)0x0)))) {
      p_Var2[6]._M_right = (_Base_ptr)table->Resize;
    }
    if ((*(long *)(p_Var2 + 7) == 0) || ((forceSetup && (table->RgbToBgr != (RgbToBgrForm4)0x0)))) {
      *(RgbToBgrForm4 *)(p_Var2 + 7) = table->RgbToBgr;
    }
    if ((p_Var2[7]._M_parent == (_Base_ptr)0x0) ||
       ((forceSetup && (table->SetPixel != (SetPixelForm1)0x0)))) {
      p_Var2[7]._M_parent = (_Base_ptr)table->SetPixel;
    }
    if ((p_Var2[7]._M_left == (_Base_ptr)0x0) ||
       ((forceSetup && (table->SetPixel2 != (SetPixelForm2)0x0)))) {
      p_Var2[7]._M_left = (_Base_ptr)table->SetPixel2;
    }
    if ((*(long *)(p_Var2 + 8) == 0) || ((forceSetup && (table->Split != (SplitForm2)0x0)))) {
      *(SplitForm2 *)(p_Var2 + 8) = table->Split;
    }
    if ((p_Var2[8]._M_parent == (_Base_ptr)0x0) ||
       ((forceSetup && (table->Subtract != (SubtractForm4)0x0)))) {
      p_Var2[8]._M_parent = (_Base_ptr)table->Subtract;
    }
    if ((p_Var2[8]._M_left == (_Base_ptr)0x0) || ((forceSetup && (table->Sum != (SumForm2)0x0)))) {
      p_Var2[8]._M_left = (_Base_ptr)table->Sum;
    }
    if ((p_Var2[8]._M_right == (_Base_ptr)0x0) ||
       ((forceSetup && (table->Threshold != (ThresholdForm4)0x0)))) {
      p_Var2[8]._M_right = (_Base_ptr)table->Threshold;
    }
    if ((*(long *)(p_Var2 + 9) == 0) ||
       ((forceSetup && (table->Threshold2 != (ThresholdDoubleForm4)0x0)))) {
      *(ThresholdDoubleForm4 *)(p_Var2 + 9) = table->Threshold2;
    }
    if ((p_Var2[9]._M_parent == (_Base_ptr)0x0) ||
       ((forceSetup && (table->Transpose != (TransposeForm4)0x0)))) {
      p_Var2[9]._M_parent = (_Base_ptr)table->Transpose;
    }
  }
  return;
}

Assistant:

void ImageTypeManager::setFunctionTable( uint8_t type, const Image_Function_Helper::FunctionTableHolder & table, bool forceSetup )
{
    std::map< uint8_t, Image_Function_Helper::FunctionTableHolder >::iterator oldTable = _functionTableMap.find( type );
    if ( oldTable != _functionTableMap.end() )
        setupTable( oldTable->second, table, forceSetup );
    else
        _functionTableMap[type] = table;
}